

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastTimer.cpp
# Opt level: O1

void __thiscall FastTimer::timerEvent(FastTimer *this,QTimerEvent *evt)

{
  int iVar1;
  CallbackFn UNRECOVERED_JUMPTABLE;
  void *pvVar2;
  bool bVar3;
  
  LOCK();
  bVar3 = (this->mMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
  if (bVar3) {
    (this->mMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
  }
  UNLOCK();
  if (!bVar3) {
    QBasicMutex::lockInternal();
  }
  iVar1 = this->mTimerId;
  UNRECOVERED_JUMPTABLE = this->mCallback;
  pvVar2 = this->mCallbackData;
  LOCK();
  bVar3 = (this->mMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x1;
  if (bVar3) {
    (this->mMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  }
  UNLOCK();
  if (!bVar3) {
    QBasicMutex::unlockInternal();
  }
  if (UNRECOVERED_JUMPTABLE == (CallbackFn)0x0 || *(int *)(evt + 0x10) != iVar1) {
    return;
  }
  (*UNRECOVERED_JUMPTABLE)(pvVar2);
  return;
}

Assistant:

void FastTimer::timerEvent(QTimerEvent *evt) {
    mMutex.lock();
    auto const timerId = mTimerId;
    auto const callback = mCallback;
    auto const data = mCallbackData;
    mMutex.unlock();


    if (evt->timerId() == timerId && callback) {
        callback(data);
    }

}